

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningTest::teardown
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningTest *this)

{
  MemoryLeakDetector::deallocMemory(detector,::allocator,leak1,false);
  MemoryLeakDetector::deallocMemory(detector,::allocator,leak2,false);
  if (this->fixture != (TestTestingFixture *)0x0) {
    (*this->fixture->_vptr_TestTestingFixture[1])();
  }
  if (memPlugin != (MemoryLeakWarningPlugin *)0x0) {
    (*(memPlugin->super_TestPlugin)._vptr_TestPlugin[1])();
  }
  if (detector != (MemoryLeakDetector *)0x0) {
    (*detector->_vptr_MemoryLeakDetector[1])();
  }
  if (::allocator != (TestMemoryAllocator *)0x0) {
    (*::allocator->_vptr_TestMemoryAllocator[1])();
    return;
  }
  return;
}

Assistant:

void teardown() _override
    {
        detector->deallocMemory(allocator, leak1);
        detector->deallocMemory(allocator, leak2);

        delete fixture;
        delete memPlugin;
        delete detector;
        delete allocator;
    }